

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O1

bool P_Thing_Projectile(int tid,AActor *source,int type,char *type_name,DAngle *angle,double speed,
                       double vspeed,int dest,AActor *forcedest,int gravity,int newtid,
                       bool leadTarget)

{
  bool bVar1;
  AActor *spawner;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  PClassActor *pPVar5;
  AActor *this;
  AActor **ppAVar6;
  AActor *pAVar7;
  double dVar8;
  double dVar9;
  ulong extraout_XMM0_Qb;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  DVector3 local_100;
  double local_e8;
  double local_e0;
  uint local_d4;
  double local_d0;
  uint local_c4;
  AActor *local_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  int local_9c;
  double local_98;
  AActor *local_90;
  double local_88;
  ulong uStack_80;
  AActor **local_78;
  ulong local_70;
  AActor *local_68;
  PClassActor *local_60;
  DAngle *local_58;
  double local_50;
  AActor **local_48;
  double local_40;
  _func_int **local_38;
  
  local_d0 = speed;
  local_58 = angle;
  local_50 = vspeed;
  if (type_name == (char *)0x0) {
    pPVar5 = P_GetSpawnableType(type);
  }
  else {
    pPVar5 = PClass::FindActor(type_name);
  }
  if (pPVar5 != (PClassActor *)0x0) {
    pPVar5 = PClassActor::GetReplacement(pPVar5,true);
    local_c4 = *(uint *)((pPVar5->super_PClass).Defaults + 0x1c4);
    if (((local_c4 >> 0xd & 1) == 0) ||
       (((dmflags.Value._1_1_ & 0x10) == 0 && ((level.flags2._1_1_ & 0x80) == 0)))) {
      if (tid == 0) {
        local_90 = (AActor *)0x0;
      }
      else {
        for (local_90 = AActor::TIDHash[tid & 0x7f];
            (source = local_90, local_90 != (AActor *)0x0 && (local_90->tid != tid));
            local_90 = local_90->inext) {
        }
      }
      local_d4 = 0;
      if (source != (AActor *)0x0) {
        local_70 = (ulong)(dest & 0x7f);
        bVar1 = local_d0 <= 0.0;
        local_48 = AActor::TIDHash + local_70;
        local_78 = AActor::TIDHash + (tid & 0x7f);
        local_40 = *(double *)(&DAT_0060a310 + (ulong)((local_c4 & 1) == 0) * 8);
        local_9c = tid;
        local_60 = pPVar5;
        do {
          local_c0 = source;
          if (dest == 0) {
            pAVar7 = (AActor *)0x0;
            local_68 = forcedest;
            goto LAB_0045be82;
          }
          for (pAVar7 = AActor::TIDHash[local_70];
              (local_68 = pAVar7, pAVar7 != (AActor *)0x0 && (pAVar7->tid != dest));
              pAVar7 = pAVar7->inext) {
          }
          while (forcedest = pAVar7, pAVar7 != (AActor *)0x0) {
LAB_0045be82:
            spawner = local_c0;
            local_100.Z = local_40;
            if ((local_c4 & 3) == 0) {
              local_100.Z = (local_c0->__Pos).Z;
              if ((local_100.Z != -2147483648.0) || (NAN(local_100.Z))) {
                local_100.Z = local_100.Z - local_c0->Floorclip;
              }
            }
            local_100.X = (local_c0->__Pos).X;
            local_100.Y = (local_c0->__Pos).Y;
            this = AActor::StaticSpawn(pPVar5,&local_100,ALLOW_REPLACE,false);
            uVar3 = local_d4;
            if (this != (AActor *)0x0) {
              this->tid = newtid;
              AActor::AddToHash(this);
              P_PlaySpawnSound(this,spawner);
              uVar3 = (this->flags).Value;
              if (gravity == 0) {
                (this->flags).Value = uVar3 | 0x200;
              }
              else {
                (this->flags).Value = uVar3 & 0xfffffdff;
                if ((gravity == 1) && (((this->flags3).Value & 0x2000) == 0)) {
                  this->Gravity = 0.125;
                }
              }
              (this->target).field_0.p = local_c0;
              if (forcedest == (AActor *)0x0) {
                (this->Angles).Yaw.Degrees = local_58->Degrees;
                AActor::VelFromAngle(this,local_d0);
                (this->Vel).Z = local_50;
              }
              else {
                AActor::Vec3To(&local_100,this,forcedest);
                local_100.Z = forcedest->Height * 0.5 + local_100.Z;
                if (bVar1 || !leadTarget) {
LAB_0045c04c:
                  AActor::AngleTo((AActor *)&stack0xffffffffffffffc8,this,SUB81(forcedest,0));
                  (this->Angles).Yaw.Degrees = (double)local_38;
                  dVar8 = c_sqrt(local_100.Z * local_100.Z +
                                 local_100.Y * local_100.Y + local_100.X * local_100.X);
                  if ((dVar8 != 0.0) ||
                     (dVar9 = local_100.X, dVar11 = local_100.Z, dVar10 = local_100.Y, NAN(dVar8)))
                  {
                    dVar8 = local_d0 / dVar8;
                    dVar9 = local_100.X * dVar8;
                    dVar11 = dVar8 * local_100.Z;
                    dVar10 = local_100.Y * dVar8;
                  }
                  (this->Vel).Z = dVar11;
                  (this->Vel).Y = dVar10;
                  (this->Vel).X = dVar9;
                }
                else {
                  dVar8 = (forcedest->Vel).X;
                  dVar9 = (forcedest->Vel).Y;
                  if (((((dVar8 == 0.0) && (!NAN(dVar8))) && (dVar9 == 0.0)) &&
                      ((!NAN(dVar9) && (dVar11 = (forcedest->Vel).Z, dVar11 == 0.0)))) &&
                     (!NAN(dVar11))) goto LAB_0045c04c;
                  dVar11 = (forcedest->Vel).Z;
                  if (((forcedest->flags).Value & 0x200) == 0) {
                    dVar10 = 0.0;
                    if (2 < forcedest->waterlevel) {
                      dVar10 = dVar11;
                    }
                    dVar11 = dVar10;
                    if (dVar8 == 0.0 && forcedest->waterlevel < 3) {
                      dVar10 = (forcedest->Vel).Y;
                      dVar11 = 0.0;
                      if ((dVar10 == 0.0) && (!NAN(dVar10))) goto LAB_0045c04c;
                    }
                  }
                  local_e0 = dVar11;
                  local_b8 = dVar8;
                  local_a8 = dVar9;
                  local_98 = c_sqrt(local_100.Z * local_100.Z +
                                    local_100.Y * local_100.Y + local_100.X * local_100.X);
                  local_e8 = c_sqrt(local_e0 * local_e0 + local_a8 * local_a8 + local_b8 * local_b8)
                  ;
                  dVar9 = (((-local_100.Y * local_a8 - local_100.X * local_b8) -
                           local_100.Z * local_e0) / local_e8) / local_98;
                  dVar8 = 1.0;
                  if (dVar9 <= 1.0) {
                    dVar8 = dVar9;
                  }
                  local_88 = c_acos((double)(~-(ulong)(-1.0 < dVar9) & 0xbff0000000000000 |
                                            (ulong)dVar8 & -(ulong)(-1.0 < dVar9)));
                  uVar3 = FRandom::GenRand32(&pr_leadtarget);
                  uVar4 = FRandom::GenRand32(&pr_leadtarget);
                  pPVar5 = local_60;
                  local_e8 = (((double)(int)((uVar3 & 0xff) - (uVar4 & 0xff)) * 0.1) / 255.0 + 1.1)
                             * local_e8;
                  dVar8 = FFastTrig::sin(&fasttrig,6755399441055744.0);
                  dVar8 = (dVar8 * local_e8) / local_d0;
                  uStack_80 = (extraout_XMM0_Qb ^ 0x8000000000000000) & extraout_XMM0_Qb;
                  local_88 = (double)(~-(ulong)(-1.0 < dVar8) & 0x3ff0000000000000 |
                                     (-(ulong)(1.0 <= dVar8) & 0xbff0000000000000 |
                                     ~-(ulong)(1.0 <= dVar8) & (ulong)-dVar8) &
                                     -(ulong)(-1.0 < dVar8));
                  local_e8 = local_a8 * local_100.Z - local_e0 * local_100.Y;
                  local_e0 = local_e0 * local_100.X - local_100.Z * local_b8;
                  local_b8 = local_b8 * local_100.Y - local_a8 * local_100.X;
                  dVar8 = c_sqrt(local_b8 * local_b8 + local_e0 * local_e0 + local_e8 * local_e8);
                  dVar8 = (double)(~-(ulong)(dVar8 != 0.0) & (ulong)dVar8 |
                                  (ulong)(1.0 / dVar8) & -(ulong)(dVar8 != 0.0));
                  local_e8 = local_e8 * dVar8;
                  local_e0 = local_e0 * dVar8;
                  local_b8 = dVar8 * local_b8;
                  uStack_b0 = 0;
                  dVar8 = c_asin(local_88);
                  dVar8 = FFastTrig::cos(&fasttrig,dVar8 * 683565275.5764316 + 6755399441055744.0);
                  dVar10 = 1.0 - dVar8;
                  dVar12 = dVar10 * local_e8;
                  dVar15 = local_e0 * dVar10 * local_e0;
                  dVar14 = dVar10 * local_e0 * local_b8;
                  dVar13 = local_d0 / local_98;
                  dVar11 = ((dVar12 * local_b8 + local_e0 * local_88) * local_100.Z +
                           (local_e0 * dVar12 - local_88 * local_b8) * local_100.Y +
                           (dVar8 + local_e8 * dVar12) * local_100.X) * dVar13;
                  dVar9 = ((dVar14 - local_e8 * local_88) * local_100.Z +
                          (dVar8 + dVar15) * local_100.Y +
                          (local_e0 * dVar12 + local_88 * local_b8) * local_100.X) * dVar13;
                  (this->Vel).Z =
                       dVar13 * ((((dVar10 - local_e8 * dVar12) - dVar15) + dVar8) * local_100.Z +
                                (dVar14 + local_e8 * local_88) * local_100.Y +
                                (dVar12 * local_b8 - local_e0 * local_88) * local_100.X);
                  (this->Vel).Y = dVar9;
                  (this->Vel).X = dVar11;
                  dVar8 = c_atan2(dVar9,dVar11);
                  (this->Angles).Yaw.Degrees = dVar8 * 57.29577951308232;
                }
                if (((this->flags2).Value & 0x40000000) != 0) {
                  (this->tracer).field_0.p = forcedest;
                }
              }
              if (((this->flags).Value & 0x10000) != 0) {
                dVar8 = (this->Vel).X;
                dVar9 = (this->Vel).Y;
                dVar11 = (this->Vel).Z;
                dVar8 = c_sqrt(dVar11 * dVar11 + dVar9 * dVar9 + dVar8 * dVar8);
                this->Speed = dVar8;
              }
              if (((this->flags3).Value & 3) != 0) {
                (this->Vel).Z = 0.0;
              }
              uVar3 = (this->flags).Value;
              if ((uVar3 & 1) != 0) {
                (this->flags).Value = uVar3 | 0x20000;
              }
              if (((this->flags).Value & 0x10000) == 0) {
                bVar2 = P_TestMobjLocation(this);
                uVar3 = 1;
                if (!bVar2) {
                  AActor::ClearCounters(this);
                  (*(this->super_DThinker).super_DObject._vptr_DObject[4])(this);
                  uVar3 = local_d4;
                }
              }
              else {
                bVar2 = P_CheckMissileSpawn(this,local_c0->radius);
                uVar3 = local_d4;
                if (bVar2) {
                  uVar3 = 1;
                }
              }
            }
            if (dest == 0) goto LAB_0045c6d5;
            ppAVar6 = &pAVar7->inext;
            if (pAVar7 == (AActor *)0x0) {
              ppAVar6 = local_48;
            }
            for (pAVar7 = *ppAVar6;
                (local_d4 = uVar3, pAVar7 != (AActor *)0x0 && (pAVar7->tid != dest));
                pAVar7 = pAVar7->inext) {
            }
          }
          local_68 = (AActor *)0x0;
          uVar3 = local_d4;
LAB_0045c6d5:
          if (local_9c == 0) {
            source = (AActor *)0x0;
          }
          else {
            ppAVar6 = &local_90->inext;
            if (local_90 == (AActor *)0x0) {
              ppAVar6 = local_78;
            }
            for (local_90 = *ppAVar6;
                (source = local_90, local_90 != (AActor *)0x0 && (local_90->tid != local_9c));
                local_90 = local_90->inext) {
            }
          }
          forcedest = local_68;
          local_d4 = uVar3;
        } while (source != (AActor *)0x0);
        local_d4 = (uint)(uVar3 != 0);
      }
      goto LAB_0045c727;
    }
  }
  local_d4 = 0;
LAB_0045c727:
  return SUB41(local_d4,0);
}

Assistant:

bool P_Thing_Projectile (int tid, AActor *source, int type, const char *type_name, DAngle angle,
	double speed, double vspeed, int dest, AActor *forcedest, int gravity, int newtid,
	bool leadTarget)
{
	int rtn = 0;
	PClassActor *kind;
	AActor *spot, *mobj, *targ = forcedest;
	FActorIterator iterator (tid);
	int defflags3;

	if (type_name == NULL)
	{
		kind = P_GetSpawnableType(type);
	}
	else
	{
		kind = PClass::FindActor(type_name);
	}
	if (kind == NULL)
	{
		return false;
	}

	// Handle decorate replacements.
	kind = kind->GetReplacement();

	defflags3 = GetDefaultByType(kind)->flags3;
	if ((defflags3 & MF3_ISMONSTER) && 
		((dmflags & DF_NO_MONSTERS) || (level.flags2 & LEVEL2_NOMONSTERS)))
		return false;

	if (tid == 0)
	{
		spot = source;
	}
	else
	{
		spot = iterator.Next();
	}
	while (spot != NULL)
	{
		FActorIterator tit (dest);

		if (dest == 0 || (targ = tit.Next()))
		{
			do
			{
				double z = spot->Z();
				if (defflags3 & MF3_FLOORHUGGER)
				{
					z = ONFLOORZ;
				}
				else if (defflags3 & MF3_CEILINGHUGGER)
				{
					z = ONCEILINGZ;
				}
				else if (z != ONFLOORZ)
				{
					z -= spot->Floorclip;
				}
				mobj = Spawn (kind, spot->PosAtZ(z), ALLOW_REPLACE);

				if (mobj)
				{
					mobj->tid = newtid;
					mobj->AddToHash ();
					P_PlaySpawnSound(mobj, spot);
					if (gravity)
					{
						mobj->flags &= ~MF_NOGRAVITY;
						if (!(mobj->flags3 & MF3_ISMONSTER) && gravity == 1)
						{
							mobj->Gravity = 1./8;
						}
					}
					else
					{
						mobj->flags |= MF_NOGRAVITY;
					}
					mobj->target = spot;

					if (targ != NULL)
					{
						DVector3 aim = mobj->Vec3To(targ);
						aim.Z += targ->Height / 2;

						if (leadTarget && speed > 0 && !targ->Vel.isZero())
						{
							// Aiming at the target's position some time in the future
							// is basically just an application of the law of sines:
							//     a/sin(A) = b/sin(B)
							// Thanks to all those on the notgod phorum for helping me
							// with the math. I don't think I would have thought of using
							// trig alone had I been left to solve it by myself.

							DVector3 tvel = targ->Vel;
							if (!(targ->flags & MF_NOGRAVITY) && targ->waterlevel < 3)
							{ // If the target is subject to gravity and not underwater,
							  // assume that it isn't moving vertically. Thanks to gravity,
							  // even if we did consider the vertical component of the target's
							  // velocity, we would still miss more often than not.
								tvel.Z = 0.0;
								if (targ->Vel.X == 0 && targ->Vel.Y == 0)
								{
									goto nolead;
								}
							}
							double dist = aim.Length();
							double targspeed = tvel.Length();
							double ydotx = -aim | tvel;
							double a = g_acos (clamp (ydotx / targspeed / dist, -1.0, 1.0));
							double multiplier = double(pr_leadtarget.Random2())*0.1/255+1.1;
							double sinb = -clamp (targspeed*multiplier * g_sin(a) / speed, -1.0, 1.0);

							// Use the cross product of two of the triangle's sides to get a
							// rotation vector.
							DVector3 rv(tvel ^ aim);
							// The vector must be normalized.
							rv.MakeUnit();
							// Now combine the rotation vector with angle b to get a rotation matrix.
							DMatrix3x3 rm(rv, g_cos(g_asin(sinb)), sinb);
							// And multiply the original aim vector with the matrix to get a
							// new aim vector that leads the target.
							DVector3 aimvec = rm * aim;
							// And make the projectile follow that vector at the desired speed.
							mobj->Vel = aimvec * (speed / dist);
							mobj->AngleFromVel();
						}
						else
						{
nolead:
							mobj->Angles.Yaw = mobj->AngleTo(targ);
							mobj->Vel = aim.Resized (speed);
						}
						if (mobj->flags2 & MF2_SEEKERMISSILE)
						{
							mobj->tracer = targ;
						}
					}
					else
					{
						mobj->Angles.Yaw = angle;
						mobj->VelFromAngle(speed);
						mobj->Vel.Z = vspeed;
					}
					// Set the missile's speed to reflect the speed it was spawned at.
					if (mobj->flags & MF_MISSILE)
					{
						mobj->Speed = mobj->VelToSpeed();
					}
					// Hugger missiles don't have any vertical velocity
					if (mobj->flags3 & (MF3_FLOORHUGGER|MF3_CEILINGHUGGER))
					{
						mobj->Vel.Z = 0;
					}
					if (mobj->flags & MF_SPECIAL)
					{
						mobj->flags |= MF_DROPPED;
					}
					if (mobj->flags & MF_MISSILE)
					{
						if (P_CheckMissileSpawn (mobj, spot->radius))
						{
							rtn = true;
						}
					}
					else if (!P_TestMobjLocation (mobj))
					{
						// If this is a monster, subtract it from the total monster
						// count, because it already added to it during spawning.
						mobj->ClearCounters();
						mobj->Destroy ();
					}
					else
					{
						// It spawned fine.
						rtn = 1;
					}
				}
			} while (dest != 0 && (targ = tit.Next()));
		}
		spot = iterator.Next();
	}

	return rtn != 0;
}